

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImU32 IVar3;
  ImU32 IVar4;
  uint uVar5;
  byte bVar6;
  undefined1 in_register_00001208 [56];
  undefined1 in_register_00001248 [56];
  undefined8 in_XMM3_Qb;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  ImVec2 local_b0;
  ImVec2 local_a8;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = p_max;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = p_min;
  local_a8 = (ImVec2)vmovlps_avx(auVar9._0_16_);
  local_b0 = (ImVec2)vmovlps_avx(auVar11._0_16_);
  if (col < 0xff000000) {
    local_78 = grid_off.x;
    fStack_74 = grid_off.y;
    uStack_70 = in_XMM3_Qb;
    IVar3 = ImAlphaBlendColors(0xffcccccc,col);
    IVar3 = GetColorU32(IVar3);
    IVar4 = ImAlphaBlendColors(0xff808080,col);
    IVar4 = GetColorU32(IVar4);
    ImDrawList::AddRectFilled(draw_list,&local_a8,&local_b0,IVar3,rounding,rounding_corners_flags);
    auVar2._4_4_ = fStack_74;
    auVar2._0_4_ = local_78;
    auVar2._8_8_ = uStack_70;
    auVar2 = vmovshdup_avx(auVar2);
    local_68 = ZEXT416((uint)local_a8.y);
    local_98 = auVar2._0_4_ + local_a8.y;
    auVar9 = ZEXT464((uint)local_b0.y);
    if (local_98 < local_b0.y) {
      auVar11 = ZEXT464((uint)local_a8.x);
      local_9c = local_78 + local_a8.x;
      bVar6 = 0;
      auVar12 = ZEXT464((uint)local_b0.x);
      local_90 = local_b0.y;
      local_58 = ZEXT416((uint)local_a8.x);
      local_94 = local_b0.x;
      do {
        auVar1 = vminss_avx(auVar9._0_16_,ZEXT416((uint)local_98));
        auVar2 = vcmpss_avx(ZEXT416((uint)local_98),local_68,1);
        local_48 = vblendvps_avx(auVar1,local_68,auVar2);
        auVar7 = ZEXT1664(local_48);
        local_98 = local_98 + grid_step;
        auVar2 = vminss_avx(ZEXT416((uint)local_98),auVar9._0_16_);
        auVar8 = ZEXT1664(auVar2);
        local_8c = auVar2._0_4_;
        if ((local_48._0_4_ < local_8c) &&
           (local_78 = (float)bVar6 * grid_step + local_9c, local_78 < auVar12._0_4_)) {
          do {
            auVar1 = vminss_avx(auVar12._0_16_,ZEXT416((uint)local_78));
            auVar2 = vcmpss_avx(ZEXT416((uint)local_78),auVar11._0_16_,1);
            auVar2 = vblendvps_avx(auVar1,auVar11._0_16_,auVar2);
            auVar1 = vminss_avx(ZEXT416((uint)(local_78 + grid_step)),auVar12._0_16_);
            local_80.x = auVar2._0_4_;
            local_88.x = auVar1._0_4_;
            if (local_80.x < local_88.x) {
              uVar5 = 0;
              local_80.y = auVar7._0_4_;
              fVar10 = auVar11._0_4_;
              if (local_80.y <= (float)local_68._0_4_) {
                uVar5 = (uint)(local_80.x <= fVar10);
                if (auVar12._0_4_ <= local_88.x) {
                  uVar5 = local_80.x <= fVar10 | 2;
                }
              }
              local_88.y = auVar8._0_4_;
              if (auVar9._0_4_ <= local_88.y) {
                if (local_80.x <= fVar10) {
                  uVar5 = uVar5 + 4;
                }
                if (auVar12._0_4_ <= local_88.x) {
                  uVar5 = uVar5 | 8;
                }
              }
              fVar10 = 0.0;
              if ((uVar5 & rounding_corners_flags) != 0) {
                fVar10 = rounding;
              }
              ImDrawList::AddRectFilled
                        (draw_list,&local_80,&local_88,IVar4,fVar10,uVar5 & rounding_corners_flags);
              auVar9 = ZEXT464((uint)local_90);
              auVar11 = ZEXT1664(local_58);
              auVar12 = ZEXT464((uint)local_94);
              auVar7 = ZEXT1664(local_48);
              auVar8 = ZEXT464((uint)local_8c);
            }
            local_78 = local_78 + grid_step + grid_step;
          } while (local_78 < auVar12._0_4_);
        }
        bVar6 = bVar6 ^ 1;
      } while (local_98 < auVar9._0_4_);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_a8,&local_b0,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}